

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeCondition(TranslateToFuzzReader *this)

{
  uint32_t uVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  
  pEVar2 = make(this,(Type)0x2);
  uVar1 = Random::upTo(&this->random,2);
  pEVar3 = pEVar2;
  if (uVar1 == 0) {
    pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    pEVar3->_id = UnaryId;
    (pEVar3->type).id = 0;
    *(undefined4 *)(pEVar3 + 1) = 0x14;
    pEVar3[1].type.id = (uintptr_t)pEVar2;
    wasm::Unary::finalize();
  }
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeCondition() {
  // We want a 50-50 chance for the condition to be taken, for interesting
  // execution paths. by itself, there is bias (e.g. most consts are "yes") so
  // even that out with noise
  auto* ret = make(Type::i32);
  if (oneIn(2)) {
    ret = builder.makeUnary(UnaryOp::EqZInt32, ret);
  }
  return ret;
}